

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

void * RPLIDARExpressScanThread(void *pParam)

{
  double dVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  deque<double,_std::allocator<double>_> local_2f0;
  deque<double,_std::allocator<double>_> local_2a0;
  int local_250;
  int local_24c;
  int nbprev;
  int nb;
  int j;
  int i;
  BOOL bAutoNewScan;
  BOOL bNewScan;
  double distances [32];
  double angles [32];
  int local_2c;
  int err;
  int res;
  int id;
  RPLIDAR *pRPLIDAR;
  void *pParam_local;
  
  err = 0;
  local_2c = 0;
  i = 0;
  j = 0;
  nb = 0;
  nbprev = 0;
  local_24c = 0;
  local_250 = 0;
  while (addrsRPLIDAR[err] != pParam) {
    err = err + 1;
    if (0xf < err) {
      return (void *)0x0;
    }
  }
  EnterCriticalSection(RPLIDARCS + err);
  memset(&local_2a0,0,0x50);
  std::deque<double,_std::allocator<double>_>::deque(&local_2a0);
  std::deque<double,_std::allocator<double>_>::operator=(anglesvectorRPLIDAR + err,&local_2a0);
  std::deque<double,_std::allocator<double>_>::~deque(&local_2a0);
  memset(&local_2f0,0,0x50);
  std::deque<double,_std::allocator<double>_>::deque(&local_2f0);
  std::deque<double,_std::allocator<double>_>::operator=(distancesvectorRPLIDAR + err,&local_2f0);
  std::deque<double,_std::allocator<double>_>::~deque(&local_2f0);
  LeaveCriticalSection(RPLIDARCS + err);
  do {
    memset(&bAutoNewScan,0,0x100);
    memset(distances + 0x1f,0,0x100);
    iVar2 = GetExpressScanDataResponseRPLIDAR
                      ((RPLIDAR *)pParam,(double *)&bAutoNewScan,distances + 0x1f,&i);
    if (iVar2 != 0) {
      local_2c = iVar2;
    }
    EnterCriticalSection(RPLIDARCS + err);
    memcpy(distancesRPLIDAR + err,&bAutoNewScan,0x100);
    memcpy(anglesRPLIDAR + err,distances + 0x1f,0x100);
    bNewScanRPLIDAR[err] = i;
    for (nb = 0; nb < 0x20; nb = nb + 1) {
      if (*(int *)((long)pParam + 0x6c8) == 0) {
        sVar3 = std::deque<double,_std::allocator<double>_>::size(anglesvectorRPLIDAR + err);
        if ((int)sVar3 < 5) {
LAB_00113ef7:
          j = 0;
        }
        else {
          dVar1 = distances[(long)nb + 0x1f];
          sVar3 = std::deque<double,_std::allocator<double>_>::size(anglesvectorRPLIDAR + err);
          pvVar4 = std::deque<double,_std::allocator<double>_>::operator[]
                             (anglesvectorRPLIDAR + err,(long)((int)sVar3 + -5));
          if (dVar1 - *pvVar4 <= 3.141592653589793) goto LAB_00113ef7;
          dVar1 = distances[(long)nb + 0x1f];
          sVar3 = std::deque<double,_std::allocator<double>_>::size(anglesvectorRPLIDAR + err);
          pvVar4 = std::deque<double,_std::allocator<double>_>::operator[]
                             (anglesvectorRPLIDAR + err,(long)((int)sVar3 + -4));
          if (dVar1 - *pvVar4 <= 3.141592653589793) goto LAB_00113ef7;
          dVar1 = distances[(long)nb + 0x1f];
          sVar3 = std::deque<double,_std::allocator<double>_>::size(anglesvectorRPLIDAR + err);
          pvVar4 = std::deque<double,_std::allocator<double>_>::operator[]
                             (anglesvectorRPLIDAR + err,(long)((int)sVar3 + -3));
          if (dVar1 - *pvVar4 <= 3.141592653589793) goto LAB_00113ef7;
          dVar1 = distances[(long)nb + 0x1f];
          sVar3 = std::deque<double,_std::allocator<double>_>::size(anglesvectorRPLIDAR + err);
          pvVar4 = std::deque<double,_std::allocator<double>_>::operator[]
                             (anglesvectorRPLIDAR + err,(long)((int)sVar3 + -2));
          if (dVar1 - *pvVar4 <= 3.141592653589793) goto LAB_00113ef7;
          dVar1 = distances[(long)nb + 0x1f];
          sVar3 = std::deque<double,_std::allocator<double>_>::size(anglesvectorRPLIDAR + err);
          pvVar4 = std::deque<double,_std::allocator<double>_>::operator[]
                             (anglesvectorRPLIDAR + err,(long)((int)sVar3 + -1));
          if (dVar1 - *pvVar4 <= 3.141592653589793) goto LAB_00113ef7;
          j = 1;
        }
        if (j != 0) {
          nbprev = local_250 - local_24c;
          while (nbprev = nbprev + -1, -1 < nbprev) {
            sVar3 = std::deque<double,_std::allocator<double>_>::size(anglesvectorRPLIDAR + err);
            if (0 < (int)sVar3) {
              std::deque<double,_std::allocator<double>_>::pop_front(anglesvectorRPLIDAR + err);
              std::deque<double,_std::allocator<double>_>::pop_front(distancesvectorRPLIDAR + err);
            }
          }
          local_250 = local_24c;
          local_24c = 0;
        }
      }
      std::deque<double,_std::allocator<double>_>::push_back
                (anglesvectorRPLIDAR + err,distances + (long)nb + 0x1f);
      std::deque<double,_std::allocator<double>_>::push_back
                (distancesvectorRPLIDAR + err,(value_type *)(&bAutoNewScan + (long)nb * 2));
      if (((*(int *)((long)pParam + 0x6c8) == 0) &&
          (local_24c = local_24c + 1, local_24c <= local_250)) &&
         (sVar3 = std::deque<double,_std::allocator<double>_>::size(anglesvectorRPLIDAR + err),
         0 < (int)sVar3)) {
        std::deque<double,_std::allocator<double>_>::pop_front(anglesvectorRPLIDAR + err);
        std::deque<double,_std::allocator<double>_>::pop_front(distancesvectorRPLIDAR + err);
      }
      if (((0 < *(int *)((long)pParam + 0x6c8)) &&
          (sVar3 = std::deque<double,_std::allocator<double>_>::size(anglesvectorRPLIDAR + err),
          *(int *)((long)pParam + 0x6c8) < (int)sVar3)) ||
         (sVar3 = std::deque<double,_std::allocator<double>_>::size(anglesvectorRPLIDAR + err),
         0x2000 < (int)sVar3)) {
        std::deque<double,_std::allocator<double>_>::pop_front(anglesvectorRPLIDAR + err);
        std::deque<double,_std::allocator<double>_>::pop_front(distancesvectorRPLIDAR + err);
      }
    }
    resRPLIDAR[err] = local_2c;
    LeaveCriticalSection(RPLIDARCS + err);
    if (bExitExpressScanRPLIDAR[err] != 0) {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE RPLIDARExpressScanThread(void* pParam)
{
	RPLIDAR* pRPLIDAR = (RPLIDAR*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double angles[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
	double distances[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
	BOOL bNewScan = FALSE, bAutoNewScan = FALSE;
	int i = 0, j = 0, nb = 0, nbprev = 0;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

#ifdef __cplusplus
	EnterCriticalSection(&RPLIDARCS[id]);
	anglesvectorRPLIDAR[id] = std::deque<double>();
	distancesvectorRPLIDAR[id] = std::deque<double>();
	LeaveCriticalSection(&RPLIDARCS[id]);
#endif // __cplusplus

	for (;;)
	{
		//mSleep(pRPLIDAR->threadperiod);
		memset(distances, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
		memset(angles, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
		res = GetExpressScanDataResponseRPLIDAR(pRPLIDAR, distances, angles, &bNewScan);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetExpressScanDataResponseRPLIDAR(pRPLIDAR, distances, angles, &bNewScan) == EXIT_SUCCESS)
		{
			EnterCriticalSection(&RPLIDARCS[id]);
			memcpy(distancesRPLIDAR[id], distances, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
			memcpy(anglesRPLIDAR[id], angles, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
			bNewScanRPLIDAR[id] = bNewScan;

#ifdef __cplusplus
			for (i = 0; i < NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; i++)
			{
				if (pRPLIDAR->maxhist == 0)
				{
					// Try to detect the beginning of a new scan with the angle discontinuity...
					// Try to be a little bit robust w.r.t. non-decreasing outliers...
					if (((int)anglesvectorRPLIDAR[id].size() >= 5)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-5]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-4]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-3]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-2]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-1]) > M_PI))
						bAutoNewScan = TRUE; else bAutoNewScan = FALSE;
					if (bAutoNewScan)
					{
						// Try to automatically remove old data...
						for (j = nbprev-nb-1; j >= 0; j--)
						{
							if ((int)anglesvectorRPLIDAR[id].size() > 0)
							{
								anglesvectorRPLIDAR[id].pop_front();
								distancesvectorRPLIDAR[id].pop_front();
							}
						}
						nbprev = nb;
						nb = 0;
					}
				}

				anglesvectorRPLIDAR[id].push_back(angles[i]);
				distancesvectorRPLIDAR[id].push_back(distances[i]);

				if (pRPLIDAR->maxhist == 0)
				{
					// Try to automatically remove old data...
					nb++;
					if ((nb <= nbprev)&&((int)anglesvectorRPLIDAR[id].size() > 0))
					{
						anglesvectorRPLIDAR[id].pop_front();
						distancesvectorRPLIDAR[id].pop_front();
					}
				}
				if (((pRPLIDAR->maxhist > 0)&&((int)anglesvectorRPLIDAR[id].size() > pRPLIDAR->maxhist))||
					((int)anglesvectorRPLIDAR[id].size() > MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR))
				{
					anglesvectorRPLIDAR[id].pop_front();
					distancesvectorRPLIDAR[id].pop_front();
				}
			}
#endif // __cplusplus

			resRPLIDAR[id] = err;
			LeaveCriticalSection(&RPLIDARCS[id]);
		}
		if (bExitExpressScanRPLIDAR[id]) break;
	}

	return 0;
}